

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.c
# Opt level: O3

value loader_metadata(void)

{
  undefined8 uVar1;
  value pvVar2;
  loader_metadata_cb_iterator_type metadata_iterator;
  undefined8 local_20;
  undefined8 local_18;
  
  uVar1 = plugin_manager_size(&loader_manager);
  pvVar2 = (value)value_create_map(0,uVar1);
  if (pvVar2 != (value)0x0) {
    local_20 = 0;
    local_18 = value_to_map(pvVar2);
    plugin_manager_iterate(&loader_manager,loader_metadata_cb_iterate,&local_20);
  }
  return pvVar2;
}

Assistant:

value loader_metadata(void)
{
	struct loader_metadata_cb_iterator_type metadata_iterator;
	value v = value_create_map(NULL, plugin_manager_size(&loader_manager));

	if (v == NULL)
	{
		return NULL;
	}

	metadata_iterator.iterator = 0;
	metadata_iterator.values = value_to_map(v);

	plugin_manager_iterate(&loader_manager, &loader_metadata_cb_iterate, (void *)&metadata_iterator);

	return v;
}